

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int Cloak_off(void)

{
  uint oindx;
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  long oldprop;
  int otyp;
  
  if (uarmc != (obj *)0x0) {
    oindx = (uint)uarmc->otyp;
    uVar1 = u.uprops[objects[(int)oindx].oc_oprop].extrinsic & 0xfffffffd;
    Oprops_off(uarmc,2);
    takeoff_mask = (long)((uint)takeoff_mask & 0xfffffffd);
    setworn((obj *)0x0,2);
    switch(oindx) {
    case 0x7c:
      if ((((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
            (youmonst.data == mons + 0x9e)) || (youmonst.data == mons + 0x7b)) &&
          (u.uprops[0xd].blocked == 0)) &&
         ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
           && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
        newsym((int)u.ux,(int)u.uy);
        bVar3 = true;
        if ((u.uprops[0xc].intrinsic == 0) && (bVar3 = true, u.uprops[0xc].extrinsic == 0)) {
          bVar3 = ((youmonst.data)->mflags1 & 0x1000000) != 0;
        }
        pcVar2 = "no longer see yourself";
        if (bVar3) {
          pcVar2 = "see through yourself";
        }
        pline("You can %s.",pcVar2);
      }
      break;
    case 0x7d:
      if (((uVar1 == 0) && (u.uprops[0x13].intrinsic == 0)) && (u.uprops[0x13].blocked == 0)) {
        discover_object(oindx,'\x01','\x01');
        pline("You sure are noisy.");
      }
      break;
    case 0x7e:
    case 0x7f:
    case 0x80:
    case 0x81:
    case 0x83:
    case 0x84:
    case 0x86:
    case 0x87:
      break;
    case 0x82:
      u.uprops[7].extrinsic = u.uprops[7].extrinsic & 0xfffffffd;
      break;
    case 0x85:
      if (((uVar1 == 0) && (u.uprops[0xd].intrinsic == 0)) &&
         (((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
        discover_object(0x85,'\x01','\x01');
        newsym((int)u.ux,(int)u.uy);
        bVar3 = true;
        if ((u.uprops[0xc].intrinsic == 0) && (bVar3 = true, u.uprops[0xc].extrinsic == 0)) {
          bVar3 = ((youmonst.data)->mflags1 & 0x1000000) != 0;
        }
        pcVar2 = "see yourself";
        if (bVar3) {
          pcVar2 = "no longer see through yourself";
        }
        pline("Suddenly you can %s.",pcVar2);
      }
      break;
    default:
      warning("Unknown type of %s (%d)","cloak",(ulong)oindx);
    }
  }
  return 0;
}

Assistant:

int Cloak_off(void)
{
    int otyp;
    long oldprop;

    if (!uarmc) return 0;

    otyp = uarmc->otyp;
    oldprop = u.uprops[objects[otyp].oc_oprop].extrinsic & ~WORN_CLOAK;

    Oprops_off(uarmc, WORN_CLOAK);

    takeoff_mask &= ~W_ARMC;
	/* For mummy wrapping, taking it off first resets `Invisible'. */
    setworn(NULL, W_ARMC);
    switch (otyp) {
	case ORCISH_CLOAK:
	case DWARVISH_CLOAK:
	case CLOAK_OF_PROTECTION:
	case CLOAK_OF_MAGIC_RESISTANCE:
	case CLOAK_OF_DISPLACEMENT:
	case OILSKIN_CLOAK:
	case ROBE:
	case LEATHER_CLOAK:
		break;
	case ELVEN_CLOAK:
		if (!oldprop && !HStealth && !BStealth) {
		    makeknown(otyp);
		    pline("You sure are noisy.");
		}
		break;
	case MUMMY_WRAPPING:
		if (Invis && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("You can %s.",
			See_invisible ? "see through yourself"
			: "no longer see yourself");
		}
		break;
	case CLOAK_OF_INVISIBILITY:
		if (!oldprop && !HInvis && !Blind) {
		    makeknown(CLOAK_OF_INVISIBILITY);
		    newsym(u.ux,u.uy);
		    pline("Suddenly you can %s.",
			See_invisible ? "no longer see through yourself"
			: see_yourself);
		}
		break;
	/* Alchemy smock gives poison _and_ acid resistance */
	case ALCHEMY_SMOCK:
		EAcid_resistance &= ~WORN_CLOAK;
		break;
	default: warning(unknown_type, c_cloak, otyp);
    }
    return 0;
}